

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShellCommand.h
# Opt level: O1

void __thiscall
llbuild::buildsystem::ShellCommand::ShellCommand
          (ShellCommand *this,StringRef name,bool controlEnabled)

{
  SmallVectorImpl<std::pair<llvm::StringRef,_llvm::StringRef>_> *pSVar1;
  SmallVectorImpl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pSVar2;
  SmallVectorImpl<llbuild::buildsystem::BuildKey> *pSVar3;
  char *pcVar4;
  
  pcVar4 = name.Data;
  (this->super_ExternalCommand).super_Command.super_JobDescriptor._vptr_JobDescriptor =
       (_func_int **)&PTR__Command_002425e0;
  (this->super_ExternalCommand).super_Command.name._M_dataplus._M_p =
       (pointer)&(this->super_ExternalCommand).super_Command.name.field_2;
  if (pcVar4 == (char *)0x0) {
    (this->super_ExternalCommand).super_Command.name._M_string_length = 0;
    (this->super_ExternalCommand).super_Command.name.field_2._M_local_buf[0] = '\0';
  }
  else {
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&(this->super_ExternalCommand).super_Command.name,pcVar4,
               pcVar4 + name.Length);
  }
  (this->super_ExternalCommand).super_Command.outputs.
  super__Vector_base<llbuild::buildsystem::BuildNode_*,_std::allocator<llbuild::buildsystem::BuildNode_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_ExternalCommand).super_Command.outputs.
  super__Vector_base<llbuild::buildsystem::BuildNode_*,_std::allocator<llbuild::buildsystem::BuildNode_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_ExternalCommand).super_Command.inputs.
  super__Vector_base<llbuild::buildsystem::BuildNode_*,_std::allocator<llbuild::buildsystem::BuildNode_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_ExternalCommand).super_Command.outputs.
  super__Vector_base<llbuild::buildsystem::BuildNode_*,_std::allocator<llbuild::buildsystem::BuildNode_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_ExternalCommand).super_Command.inputs.
  super__Vector_base<llbuild::buildsystem::BuildNode_*,_std::allocator<llbuild::buildsystem::BuildNode_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_ExternalCommand).super_Command.inputs.
  super__Vector_base<llbuild::buildsystem::BuildNode_*,_std::allocator<llbuild::buildsystem::BuildNode_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_ExternalCommand).super_Command.repairViaOwnershipAnalysis = false;
  (this->super_ExternalCommand).description._M_dataplus._M_p =
       (pointer)&(this->super_ExternalCommand).description.field_2;
  (this->super_ExternalCommand).description._M_string_length = 0;
  (this->super_ExternalCommand).description.field_2._M_local_buf[0] = '\0';
  (this->super_ExternalCommand).allowMissingInputs = false;
  (this->super_ExternalCommand).allowModifiedOutputs = false;
  (this->super_ExternalCommand).alwaysOutOfDate = false;
  (this->super_ExternalCommand).skipValue.Storage.hasVal = false;
  (this->super_ExternalCommand).missingInputKeys.
  super_SmallVectorImpl<llbuild::buildsystem::BuildKey>.
  super_SmallVectorTemplateBase<llbuild::buildsystem::BuildKey,_false>.
  super_SmallVectorTemplateCommon<llbuild::buildsystem::BuildKey,_void>.super_SmallVectorBase.BeginX
       = &(this->super_ExternalCommand).missingInputKeys.
          super_SmallVectorStorage<llbuild::buildsystem::BuildKey,_1U>;
  pSVar3 = &(this->super_ExternalCommand).missingInputKeys.
            super_SmallVectorImpl<llbuild::buildsystem::BuildKey>;
  (pSVar3->super_SmallVectorTemplateBase<llbuild::buildsystem::BuildKey,_false>).
  super_SmallVectorTemplateCommon<llbuild::buildsystem::BuildKey,_void>.super_SmallVectorBase.Size =
       0;
  (pSVar3->super_SmallVectorTemplateBase<llbuild::buildsystem::BuildKey,_false>).
  super_SmallVectorTemplateCommon<llbuild::buildsystem::BuildKey,_void>.super_SmallVectorBase.
  Capacity = 1;
  (this->super_ExternalCommand).canUpdateIfNewer = true;
  (this->super_ExternalCommand).hasPriorResult = false;
  (this->super_ExternalCommand).super_Command.super_JobDescriptor._vptr_JobDescriptor =
       (_func_int **)&PTR__ShellCommand_00243a58;
  (this->args).super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->args).super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->args).super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->signatureData)._M_dataplus._M_p = (pointer)&(this->signatureData).field_2;
  (this->signatureData)._M_string_length = 0;
  (this->signatureData).field_2._M_local_buf[0] = '\0';
  (this->env).super_SmallVectorImpl<std::pair<llvm::StringRef,_llvm::StringRef>_>.
  super_SmallVectorTemplateBase<std::pair<llvm::StringRef,_llvm::StringRef>,_true>.
  super_SmallVectorTemplateCommon<std::pair<llvm::StringRef,_llvm::StringRef>,_void>.
  super_SmallVectorBase.BeginX =
       &(this->env).super_SmallVectorStorage<std::pair<llvm::StringRef,_llvm::StringRef>,_1U>;
  pSVar1 = &(this->env).super_SmallVectorImpl<std::pair<llvm::StringRef,_llvm::StringRef>_>;
  (pSVar1->super_SmallVectorTemplateBase<std::pair<llvm::StringRef,_llvm::StringRef>,_true>).
  super_SmallVectorTemplateCommon<std::pair<llvm::StringRef,_llvm::StringRef>,_void>.
  super_SmallVectorBase.Size = 0;
  (pSVar1->super_SmallVectorTemplateBase<std::pair<llvm::StringRef,_llvm::StringRef>,_true>).
  super_SmallVectorTemplateCommon<std::pair<llvm::StringRef,_llvm::StringRef>,_void>.
  super_SmallVectorBase.Capacity = 1;
  (this->depsPaths).
  super_SmallVectorImpl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .
  super_SmallVectorTemplateBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  .
  super_SmallVectorTemplateCommon<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
  .super_SmallVectorBase.BeginX =
       &(this->depsPaths).
        super_SmallVectorStorage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_1U>
  ;
  pSVar2 = &(this->depsPaths).
            super_SmallVectorImpl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ;
  (pSVar2->
  super_SmallVectorTemplateBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  ).
  super_SmallVectorTemplateCommon<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
  .super_SmallVectorBase.Size = 0;
  (pSVar2->
  super_SmallVectorTemplateBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  ).
  super_SmallVectorTemplateCommon<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
  .super_SmallVectorBase.Capacity = 1;
  this->depsStyle = Unused;
  this->inheritEnv = true;
  this->canSafelyInterrupt = true;
  (this->workingDirectory)._M_dataplus._M_p = (pointer)&(this->workingDirectory).field_2;
  (this->workingDirectory)._M_string_length = 0;
  (this->workingDirectory).field_2._M_local_buf[0] = '\0';
  this->controlEnabled = controlEnabled;
  (this->cachedSignature)._M_i.value = 0;
  (this->handlerState)._M_t.
  super___uniq_ptr_impl<llbuild::buildsystem::HandlerState,_std::default_delete<llbuild::buildsystem::HandlerState>_>
  ._M_t.
  super__Tuple_impl<0UL,_llbuild::buildsystem::HandlerState_*,_std::default_delete<llbuild::buildsystem::HandlerState>_>
  .super__Head_base<0UL,_llbuild::buildsystem::HandlerState_*,_false>._M_head_impl =
       (HandlerState *)0x0;
  return;
}

Assistant:

ShellCommand(StringRef name, bool controlEnabled) : ExternalCommand(name),
    controlEnabled(controlEnabled) { }